

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

ON_SumSurface * __thiscall
ON_Extrusion::SumSurfaceForm(ON_Extrusion *this,ON_SumSurface *sum_surface)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ON_PolyCurve *this_00;
  ON_Curve *pOVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ON_LineCurve *pOVar6;
  ON_LineCurve *this_01;
  ON_LineCurve *pOVar7;
  bool bVar8;
  long lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ON_Interval domain;
  ON_Interval domain_00;
  ON_Xform xform0;
  ON_BoundingBox local_e0;
  ON_Xform local_b0;
  
  if (sum_surface != (ON_SumSurface *)0x0) {
    lVar9 = 0;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      if (sum_surface->m_curve[lVar9] != (ON_Curve *)0x0) {
        (*(sum_surface->m_curve[lVar9]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        sum_surface->m_curve[lVar9] = (ON_Curve *)0x0;
      }
      (sum_surface->m_basepoint).z = ON_3dVector::ZeroVector.z;
      dVar1 = ON_3dVector::ZeroVector.y;
      (sum_surface->m_basepoint).x = ON_3dVector::ZeroVector.x;
      (sum_surface->m_basepoint).y = dVar1;
      ON_BoundingBox::Destroy(&sum_surface->m_bbox);
      lVar9 = 1;
      bVar3 = false;
    } while (bVar8);
  }
  if (this->m_profile != (ON_Curve *)0x0) {
    bVar3 = ON_Line::IsValid(&this->m_path);
    if ((bVar3) && (iVar4 = IsMitered(this), iVar4 == 0)) {
      ON_Xform::ON_Xform(&local_b0);
      bVar3 = GetProfileTransformation(this,0.0,&local_b0);
      if (bVar3) {
        iVar4 = ProfileCount(this);
        if ((((iVar4 == 1) &&
             (this_00 = ON_PolyCurve::Cast((ON_Object *)this->m_profile),
             this_00 != (ON_PolyCurve *)0x0)) && (iVar4 = ON_PolyCurve::Count(this_00), iVar4 == 1))
           && (pOVar5 = ON_PolyCurve::SegmentCurve(this_00,0), pOVar5 != (ON_Curve *)0x0)) {
          iVar4 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pOVar5);
          pOVar7 = (ON_LineCurve *)CONCAT44(extraout_var,iVar4);
          (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
          domain.m_t[0]._4_4_ = extraout_XMM0_Db;
          domain.m_t[0]._0_4_ = extraout_XMM0_Da;
          domain.m_t[1]._4_4_ = in_XMM1_Db;
          domain.m_t[1]._0_4_ = in_XMM1_Da;
          ON_Curve::SetDomain((ON_Curve *)pOVar7,domain);
        }
        else {
          iVar4 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
          pOVar7 = (ON_LineCurve *)CONCAT44(extraout_var_00,iVar4);
          if (pOVar7 == (ON_LineCurve *)0x0) {
            return (ON_SumSurface *)0x0;
          }
        }
        iVar4 = (*(pOVar7->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                          (0,pOVar7);
        this_01 = pOVar7;
        if (((char)iVar4 != '\0') &&
           (pOVar6 = ON_LineCurve::Cast((ON_Object *)pOVar7), pOVar6 == (ON_LineCurve *)0x0)) {
          this_01 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve::ON_LineCurve(this_01);
          ON_Curve::PointAtStart(&local_e0.m_min,&pOVar7->super_ON_Curve);
          (this_01->m_line).from.z = (double)CONCAT44(local_e0.m_min.z._4_4_,local_e0.m_min.z._0_4_)
          ;
          (this_01->m_line).from.x = (double)CONCAT44(local_e0.m_min.x._4_4_,local_e0.m_min.x._0_4_)
          ;
          (this_01->m_line).from.y = (double)CONCAT44(local_e0.m_min.y._4_4_,local_e0.m_min.y._0_4_)
          ;
          ON_Curve::PointAtEnd(&local_e0.m_min,&pOVar7->super_ON_Curve);
          (this_01->m_line).to.z = (double)CONCAT44(local_e0.m_min.z._4_4_,local_e0.m_min.z._0_4_);
          *(undefined4 *)&(this_01->m_line).to.x = local_e0.m_min.x._0_4_;
          *(undefined4 *)((long)&(this_01->m_line).to.x + 4) = local_e0.m_min.x._4_4_;
          *(undefined4 *)&(this_01->m_line).to.y = local_e0.m_min.y._0_4_;
          *(undefined4 *)((long)&(this_01->m_line).to.y + 4) = local_e0.m_min.y._4_4_;
          (*(pOVar7->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                    (pOVar7);
          domain_00.m_t[0]._4_4_ = extraout_XMM0_Db_00;
          domain_00.m_t[0]._0_4_ = extraout_XMM0_Da_00;
          domain_00.m_t[1]._4_4_ = in_XMM1_Db;
          domain_00.m_t[1]._0_4_ = in_XMM1_Da;
          ON_Curve::SetDomain((ON_Curve *)this_01,domain_00);
          (*(pOVar7->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(pOVar7);
        }
        iVar4 = (*(this_01->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
                          (this_01,3);
        if (((char)iVar4 == '\0') ||
           ((bVar3 = ON_Xform::IsIdentity(&local_b0,0.0), !bVar3 &&
            (iVar4 = (*(this_01->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                       [0x1c])(this_01,&local_b0), (char)iVar4 == '\0')))) {
          pOVar7 = (ON_LineCurve *)0x0;
        }
        else {
          pOVar7 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve::ON_LineCurve(pOVar7);
          (pOVar7->m_line).from.z = ON_3dPoint::Origin.z;
          dVar1 = ON_3dPoint::Origin.y;
          (pOVar7->m_line).from.x = ON_3dPoint::Origin.x;
          (pOVar7->m_line).from.y = dVar1;
          ON_3dPoint::operator-((ON_3dVector *)&local_e0,&(this->m_path).to,&(this->m_path).from);
          ON_3dPoint::operator=(&(pOVar7->m_line).to,(ON_3dVector *)&local_e0);
          dVar1 = ON_Interval::operator[](&this->m_path_domain,0);
          dVar2 = ON_Interval::operator[](&this->m_path_domain,1);
          iVar4 = (*(pOVar7->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26]
                  )(SUB84(dVar1,0),SUB84(dVar2,0),pOVar7);
          if ((char)iVar4 != '\0') {
            if (sum_surface == (ON_SumSurface *)0x0) {
              sum_surface = (ON_SumSurface *)operator_new(0x68);
              ON_SumSurface::ON_SumSurface(sum_surface);
            }
            sum_surface->m_curve[0] = &this_01->super_ON_Curve;
            sum_surface->m_curve[1] = (ON_Curve *)pOVar7;
            dVar1 = ON_3dVector::ZeroVector.y;
            (sum_surface->m_basepoint).x = ON_3dVector::ZeroVector.x;
            (sum_surface->m_basepoint).y = dVar1;
            (sum_surface->m_basepoint).z = ON_3dVector::ZeroVector.z;
            ON_Geometry::BoundingBox(&local_e0,(ON_Geometry *)this);
            *(undefined4 *)&(sum_surface->m_bbox).m_max.y = local_e0.m_max.y._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_max.y + 4) = local_e0.m_max.y._4_4_;
            *(undefined4 *)&(sum_surface->m_bbox).m_max.z = local_e0.m_max.z._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_max.z + 4) = local_e0.m_max.z._4_4_;
            *(undefined4 *)&(sum_surface->m_bbox).m_min.z = local_e0.m_min.z._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_min.z + 4) = local_e0.m_min.z._4_4_;
            *(undefined4 *)&(sum_surface->m_bbox).m_max.x = local_e0.m_max.x._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_max.x + 4) = local_e0.m_max.x._4_4_;
            *(undefined4 *)&(sum_surface->m_bbox).m_min.x = local_e0.m_min.x._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_min.x + 4) = local_e0.m_min.x._4_4_;
            *(undefined4 *)&(sum_surface->m_bbox).m_min.y = local_e0.m_min.y._0_4_;
            *(undefined4 *)((long)&(sum_surface->m_bbox).m_min.y + 4) = local_e0.m_min.y._4_4_;
            if (this->m_bTransposed == true) {
              (*(sum_surface->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x36])(sum_surface);
              return sum_surface;
            }
            return sum_surface;
          }
        }
        (*(this_01->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_01);
        if (pOVar7 != (ON_LineCurve *)0x0) {
          (*(pOVar7->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(pOVar7);
        }
      }
    }
  }
  return (ON_SumSurface *)0x0;
}

Assistant:

ON_SumSurface* ON_Extrusion::SumSurfaceForm( 
  ON_SumSurface* sum_surface 
  ) const
{
  int i;
  if ( 0 != sum_surface )
  {
    for ( i = 0; i < 2; i++ )
    {
      if ( sum_surface->m_curve[i] )
      {
        delete sum_surface->m_curve[i];
        sum_surface->m_curve[i] = 0;
      }
      sum_surface->m_basepoint = ON_3dVector::ZeroVector;
      sum_surface->m_bbox.Destroy();
    }
  }

  if ( 0 == m_profile || !m_path.IsValid() )
    return 0;

  if ( IsMitered() )
    return 0; // mitered extrusions cannot be represented as sum surfaces

  ON_Xform xform0;
  if ( !GetProfileTransformation(0.0,xform0) )
    return 0;

  ON_Curve* profile3d = 0;
  ON_LineCurve* path = 0;
  ON_Curve* curve0 = 0;
  ON_Curve* curve1 = 0;
  for(;;)
  {
    if ( 1 == ProfileCount() )
    {
      const ON_PolyCurve* polycurve = ON_PolyCurve::Cast(m_profile);
      if ( 0 != polycurve && 1 == polycurve->Count() )
      {
        const ON_Curve* segment = polycurve->SegmentCurve(0);
        if ( 0 != segment )
        {
          profile3d = segment->DuplicateCurve();
          profile3d->SetDomain( m_profile->Domain() );
        }
      }
    }
    if ( 0 == profile3d )
    {
      profile3d = m_profile->DuplicateCurve();
      if ( 0 == profile3d )
        break;
    }
    if ( profile3d->IsLinear() && 0 == ON_LineCurve::Cast(profile3d) )
    {
      ON_LineCurve* line_curve = new ON_LineCurve();
      line_curve->m_line.from = profile3d->PointAtStart();
      line_curve->m_line.to = profile3d->PointAtEnd();
      line_curve->ON_Curve::SetDomain(profile3d->Domain());
      delete profile3d;
      profile3d = line_curve;
    }
    if ( !profile3d->ChangeDimension(3) )
      break;
    if ( !xform0.IsIdentity() && !profile3d->Transform(xform0) )
      break;

    path = new ON_LineCurve();
    if ( 0 == path )
      break;
    path->m_line.from = ON_3dPoint::Origin;
    path->m_line.to = (m_path.to - m_path.from);
    if ( !path->SetDomain( m_path_domain[0], m_path_domain[1] ) )
      break;

    curve0 = profile3d;
    curve1 = path;
    profile3d = 0;
    path = 0;
    break;
  }
  if ( 0 == curve0 || 0 == curve1 )
  {
    if ( 0 != profile3d )
      delete profile3d;
    if ( 0 != path )
      delete path;
    return 0;
  }

  ON_SumSurface* sumsrf = ( 0 != sum_surface ) ? sum_surface : new ON_SumSurface();
  if ( 0 == sumsrf )
  {
    delete curve0;
    delete curve1;
    return 0;
  }

  sumsrf->m_curve[0] = curve0;
  sumsrf->m_curve[1] = curve1;
  sumsrf->m_basepoint = ON_3dVector::ZeroVector;
  sumsrf->m_bbox = BoundingBox();

  if ( m_bTransposed )
    sumsrf->Transpose();

  return sumsrf;
}